

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cse.c
# Opt level: O0

int bb_dominates(entrypoint *ep,basic_block *bb1,basic_block *bb2,unsigned_long generation)

{
  int iVar1;
  undefined1 local_50 [8];
  ptr_list_iter parentiter__;
  basic_block *parent;
  unsigned_long generation_local;
  basic_block *bb2_local;
  basic_block *bb1_local;
  entrypoint *ep_local;
  
  if (bb2 == ep->entry->bb) {
    ep_local._4_4_ = 0;
  }
  else {
    ptrlist_forward_iterator((ptr_list_iter *)local_50,(ptr_list *)bb2->parents);
    parentiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_50);
    while (parentiter__._16_8_ != 0) {
      if (((basic_block *)parentiter__._16_8_ != bb1) &&
         (*(unsigned_long *)(parentiter__._16_8_ + 8) != generation)) {
        *(unsigned_long *)(parentiter__._16_8_ + 8) = generation;
        iVar1 = bb_dominates(ep,bb1,(basic_block *)parentiter__._16_8_,generation);
        if (iVar1 == 0) {
          return 0;
        }
      }
      parentiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_50);
    }
    ep_local._4_4_ = 1;
  }
  return ep_local._4_4_;
}

Assistant:

static int bb_dominates(struct entrypoint *ep, struct basic_block *bb1, struct basic_block *bb2, unsigned long generation)
{
	struct basic_block *parent;

	/* Nothing dominates the entrypoint.. */
	if (bb2 == ep->entry->bb)
		return 0;
	FOR_EACH_PTR(bb2->parents, parent) {
		if (parent == bb1)
			continue;
		if (parent->generation == generation)
			continue;
		parent->generation = generation;
		if (!bb_dominates(ep, bb1, parent, generation))
			return 0;
	} END_FOR_EACH_PTR(parent);
	return 1;
}